

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::RcTree_Encode(CRangeEnc *rc,UInt16 *probs,int numBitLevels,UInt32 symbol)

{
  uint symbol_00;
  int local_28;
  UInt32 bit;
  int i;
  UInt32 m;
  UInt32 symbol_local;
  int numBitLevels_local;
  UInt16 *probs_local;
  CRangeEnc *rc_local;
  
  bit = 1;
  local_28 = numBitLevels;
  while (local_28 != 0) {
    local_28 = local_28 + -1;
    symbol_00 = symbol >> ((byte)local_28 & 0x1f) & 1;
    RangeEnc_EncodeBit(rc,probs + bit,symbol_00);
    bit = bit << 1 | symbol_00;
  }
  return;
}

Assistant:

static void RcTree_Encode(CRangeEnc* rc, CLzmaProb* probs, int numBitLevels, UInt32 symbol) {
  UInt32 m = 1;
  int i;
  for (i = numBitLevels; i != 0;) {
    UInt32 bit;
    i--;
    bit = (symbol >> i) & 1;
    RangeEnc_EncodeBit(rc, probs + m, bit);
    m = (m << 1) | bit;
  }
}